

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
get_alignment_heads_by_layer(whisper_context_params *cparams,int il,int n_text_layer,int n_head)

{
  ulong uVar1;
  whisper_ahead *pwVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  int in_R8D;
  size_t i_1;
  whisper_aheads aheads;
  int32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ret;
  value_type_conflict5 *in_stack_ffffffffffffff78;
  mapped_type *in_stack_ffffffffffffff80;
  mapped_type *local_78;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_58;
  int local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x201548);
  if (*(int *)(in_RSI + 0xc) != 0) {
    if (*(int *)(in_RSI + 0xc) == 1) {
      if (in_ECX - *(int *)(in_RSI + 0x10) <= in_EDX) {
        for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
      }
    }
    else {
      if (*(int *)(in_RSI + 0xc) == 2) {
        local_78 = (mapped_type *)(in_RSI + 0x18);
      }
      else {
        in_stack_ffffffffffffff80 =
             std::
             map<whisper_alignment_heads_preset,_whisper_aheads,_std::less<whisper_alignment_heads_preset>,_std::allocator<std::pair<const_whisper_alignment_heads_preset,_whisper_aheads>_>_>
             ::at((map<whisper_alignment_heads_preset,_whisper_aheads,_std::less<whisper_alignment_heads_preset>,_std::allocator<std::pair<const_whisper_alignment_heads_preset,_whisper_aheads>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  (key_type *)in_RDI);
        local_78 = in_stack_ffffffffffffff80;
      }
      uVar1 = local_78->n_heads;
      pwVar2 = local_78->heads;
      for (local_58 = 0; local_58 < uVar1; local_58 = local_58 + 1) {
        if (pwVar2[local_58].n_text_layer == in_EDX) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

static std::vector<uint32_t> get_alignment_heads_by_layer(const whisper_context_params & cparams, int il, int n_text_layer, int n_head) {
    std::vector<uint32_t> ret;
    if (cparams.dtw_aheads_preset == WHISPER_AHEADS_NONE) {
        return ret;
    } else if (cparams.dtw_aheads_preset == WHISPER_AHEADS_N_TOP_MOST) {
        if (il >= n_text_layer - cparams.dtw_n_top) {
            for (int32_t i = 0; i < n_head; ++i) {
                ret.push_back(i);
            }
        }
    } else {
        const auto aheads = cparams.dtw_aheads_preset == WHISPER_AHEADS_CUSTOM ? cparams.dtw_aheads : g_aheads.at(cparams.dtw_aheads_preset);
        for (size_t i = 0; i < aheads.n_heads; ++i) {
            if (aheads.heads[i].n_text_layer == il) {
                ret.push_back(aheads.heads[i].n_head);
            }
        }
    }
    return ret;
}